

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bipc.c
# Opt level: O2

void nn_bipc_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint uVar1;
  nn_list_item *it;
  char *pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)(uint)src;
  if (*(int *)&self[1].fn == 2) {
    if (src == 1) {
      if (0xfffffffd < type - 9U) {
        return;
      }
      nn_backtrace_print();
      pcVar2 = "type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED";
      uVar3 = 0xf3;
    }
    else {
      if (src == 2) {
        if (type == 0x85b9) {
          nn_list_erase((nn_list *)&self[8].state,(nn_list_item *)((long)srcptr + 0x720));
          nn_aipc_term((nn_aipc *)srcptr);
          nn_free(srcptr);
          return;
        }
        if (type == 0x85b8) {
          nn_aipc_stop((nn_aipc *)srcptr);
          return;
        }
        if (type == 0x85b7) {
          it = nn_list_end((nn_list *)&self[8].state);
          nn_list_insert((nn_list *)&self[8].state,(nn_list_item *)((long)srcptr + 0x720),it);
          self[8].shutdown_fn = (nn_fsm_fn)0x0;
          nn_bipc_start_accepting((nn_bipc *)self);
          return;
        }
        nn_backtrace_print();
        uVar1 = *(uint *)&self[1].fn;
        pcVar2 = "Unexpected action";
        uVar4 = 2;
        uVar3 = 0x10b;
        goto LAB_00122cb2;
      }
      nn_backtrace_print();
      pcVar2 = "src == NN_BIPC_SRC_AIPC";
      uVar3 = 0xf8;
    }
  }
  else {
    if (*(int *)&self[1].fn != 1) {
      nn_backtrace_print();
      uVar1 = *(uint *)&self[1].fn;
      pcVar2 = "Unexpected state";
      uVar3 = 0x112;
LAB_00122cb2:
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n",pcVar2,(ulong)uVar1,uVar4,
              (ulong)(uint)type,
              "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
              ,uVar3);
      goto LAB_00122c73;
    }
    if (src == -2) {
      if (type == -2) {
        *(undefined4 *)&self[1].fn = 2;
        return;
      }
      nn_backtrace_print();
      pcVar2 = "type == NN_FSM_START";
      uVar3 = 0xe9;
    }
    else {
      nn_backtrace_print();
      pcVar2 = "src == NN_FSM_ACTION";
      uVar3 = 0xe8;
    }
  }
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",pcVar2,
          "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ipc/bipc.c"
          ,uVar3);
LAB_00122c73:
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_bipc_handler (struct nn_fsm *self, int src, int type,
    void *srcptr)
{
    struct nn_bipc *bipc;
    struct nn_aipc *aipc;

    bipc = nn_cont (self, struct nn_bipc, fsm);

    switch (bipc->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/******************************************************************************/
    case NN_BIPC_STATE_IDLE:
        nn_assert (src == NN_FSM_ACTION);
        nn_assert (type == NN_FSM_START);
        bipc->state = NN_BIPC_STATE_ACTIVE;
        return;

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  The execution is yielded to the aipc state machine in this state.         */
/******************************************************************************/
    case NN_BIPC_STATE_ACTIVE:
        if (src == NN_BIPC_SRC_USOCK) {
            nn_assert (type == NN_USOCK_SHUTDOWN || type == NN_USOCK_STOPPED);
            return;
        }

        /* All other events come from child aipc objects. */
        nn_assert (src == NN_BIPC_SRC_AIPC);
        aipc = (struct nn_aipc*) srcptr;
        switch (type) {
        case NN_AIPC_ACCEPTED:

            nn_list_insert (&bipc->aipcs, &aipc->item,
                nn_list_end (&bipc->aipcs));
            bipc->aipc = NULL;
            nn_bipc_start_accepting (bipc);
            return;
        case NN_AIPC_ERROR:
            nn_aipc_stop (aipc);
            return;
        case NN_AIPC_STOPPED:
            nn_list_erase (&bipc->aipcs, &aipc->item);
            nn_aipc_term (aipc);
            nn_free (aipc);
            return;
        default:
            nn_fsm_bad_action (bipc->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (bipc->state, src, type);
    }
}